

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::argument_loader<pybind11::detail::value_and_holder&,sdf_tools::real3,float,bool>::
load_impl_sequence<0ul,1ul,2ul,3ul>(void *param_1,long param_2)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<type_caster<value_and_holder>,_type_caster<real3,_void>,_type_caster<float,_void>,_type_caster<bool>_>_>
  *__n;
  reference pvVar2;
  type_caster_generic *this;
  handle src;
  reference rVar3;
  undefined8 in_stack_ffffffffffffff60;
  undefined1 uVar4;
  type_caster<pybind11::detail::value_and_holder,_void> *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  byte bVar5;
  undefined8 in_stack_ffffffffffffff98;
  undefined1 convert;
  reference local_48;
  PyObject *local_38;
  reference local_30;
  PyObject *local_20;
  long local_18;
  void *local_10;
  
  convert = (undefined1)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  uVar4 = (undefined1)((ulong)in_stack_ffffffffffffff60 >> 0x38);
  local_18 = param_2;
  local_10 = param_1;
  __n = std::
        get<0ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<sdf_tools::real3,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<bool,void>>
                  ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<sdf_tools::real3,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<bool,_void>_>
                    *)0x182b69);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      0);
  local_20 = pvVar2->m_ptr;
  local_30 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),(size_type)__n
                       );
  std::_Bit_reference::operator_cast_to_bool(&local_30);
  bVar1 = type_caster<pybind11::detail::value_and_holder,_void>::load
                    (in_stack_ffffffffffffff68,(handle)param_1,(bool)uVar4);
  bVar5 = 1;
  if (bVar1) {
    this = (type_caster_generic *)
           std::
           get<1ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<sdf_tools::real3,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<bool,void>>
                     ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<sdf_tools::real3,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<bool,_void>_>
                       *)0x182bee);
    pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                       ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                        (local_18 + 8),1);
    local_38 = pvVar2->m_ptr;
    local_48 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)
                          CONCAT17(bVar5,in_stack_ffffffffffffff80),(size_type)__n);
    std::_Bit_reference::operator_cast_to_bool(&local_48);
    bVar1 = type_caster_generic::load(this,(handle)param_1,(bool)uVar4);
    bVar5 = 1;
    if (bVar1) {
      std::
      get<2ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<sdf_tools::real3,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<bool,void>>
                ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<sdf_tools::real3,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<bool,_void>_>
                  *)0x182c6c);
      std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),2);
      rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)
                         CONCAT17(bVar5,in_stack_ffffffffffffff80),(size_type)__n);
      std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffffa0);
      bVar1 = type_caster<float,_void>::load
                        ((type_caster<float,_void> *)rVar3._M_p,(PyObject *)rVar3._M_mask,
                         (bool)convert);
      bVar5 = 1;
      if (bVar1) {
        std::
        get<3ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<sdf_tools::real3,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<bool,void>>
                  ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<sdf_tools::real3,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<bool,_void>_>
                    *)0x182ce7);
        std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                  ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),3);
        rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)
                           CONCAT17(bVar5,in_stack_ffffffffffffff80),(size_type)__n);
        uVar4 = (undefined1)((ulong)__n >> 0x38);
        src.m_ptr = (PyObject *)rVar3._M_p;
        std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffff88);
        bVar1 = type_caster<bool,_void>::load
                          ((type_caster<bool,_void> *)CONCAT17(bVar5,in_stack_ffffffffffffff80),src,
                           (bool)uVar4);
        bVar5 = bVar1 ^ 0xff;
      }
    }
  }
  return (bVar5 & 1) == 0;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }